

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall UDPSplitPacketReader::read_packet(UDPSplitPacketReader *this)

{
  buf_t *pbVar1;
  buf_t *pbVar2;
  buf_t *__n;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  pointer pSVar7;
  ssize_t sVar8;
  _Self *p_Var9;
  pointer pSVar10;
  long lVar11;
  int in_R8D;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_140;
  iterator it_3;
  iterator it_2;
  _Self local_120;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_118;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_110;
  iterator previous;
  _Self local_f8;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_f0;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_e8;
  iterator next;
  const_iterator local_d8;
  _Self local_d0;
  _List_node_base *local_c8;
  _Self local_c0;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_b8;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_b0;
  iterator copy;
  int length;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_98;
  iterator current;
  const_iterator local_88;
  _List_node_base *local_80;
  const_iterator local_78;
  _List_node_base *local_70;
  const_iterator local_68;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_60;
  iterator temp_1;
  iterator it_1;
  const_iterator local_48;
  _List_node_base *local_40;
  const_iterator local_38;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_30;
  iterator temp;
  iterator it;
  _List_iterator<UDPSplitPacketReader::SplitPacket> local_18;
  iterator current_1;
  UDPSplitPacketReader *this_local;
  
  current_1._M_node = (_List_node_base *)this;
LAB_00125cba:
  sVar6 = std::__cxx11::
          list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
          ::size(&this->receivedPackets);
  if (((ulong)(long)this->max <= sVar6) || ((this->receivedPacket & 1U) != 0)) {
    std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_18);
    if ((this->receivedPacket & 1U) == 0) {
      it = std::__cxx11::
           list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           ::end(&this->receivedPackets);
      p_Var9 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator--(&it);
      local_18._M_node = p_Var9->_M_node;
    }
    else {
      local_18._M_node = (this->currentPacket)._M_node;
      this->receivedPacket = false;
    }
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_18);
    if ((pSVar7->hasNext & 1U) != 0) {
      std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&temp);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_18);
      temp._M_node = *(_List_node_base **)&(pSVar7->super_BufferReader).field_0x28;
      while (pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&temp),
            (pSVar7->hasNext & 1U) != 0) {
        std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_30);
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&temp);
        local_30._M_node = *(_List_node_base **)&(pSVar7->super_BufferReader).field_0x28;
        std::_List_const_iterator<UDPSplitPacketReader::SplitPacket>::_List_const_iterator
                  (&local_38,&temp);
        local_40 = (_List_node_base *)
                   std::__cxx11::
                   list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                   ::erase(&this->receivedPackets,local_38);
        temp._M_node = local_30._M_node;
      }
      std::_List_const_iterator<UDPSplitPacketReader::SplitPacket>::_List_const_iterator
                (&local_48,&temp);
      std::__cxx11::
      list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
      erase(&this->receivedPackets,local_48);
    }
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_18);
    if ((pSVar7->hasPrevious & 1U) != 0) {
      std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&temp_1);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_18);
      temp_1._M_node = (pSVar7->previous)._M_node;
      while (pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&temp_1),
            (pSVar7->hasPrevious & 1U) != 0) {
        std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_60);
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&temp_1);
        local_60._M_node = (pSVar7->previous)._M_node;
        std::_List_const_iterator<UDPSplitPacketReader::SplitPacket>::_List_const_iterator
                  (&local_68,&temp_1);
        local_70 = (_List_node_base *)
                   std::__cxx11::
                   list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                   ::erase(&this->receivedPackets,local_68);
        temp_1._M_node = local_60._M_node;
      }
      std::_List_const_iterator<UDPSplitPacketReader::SplitPacket>::_List_const_iterator
                (&local_78,&temp_1);
      local_80 = (_List_node_base *)
                 std::__cxx11::
                 list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
                 ::erase(&this->receivedPackets,local_78);
    }
    std::_List_const_iterator<UDPSplitPacketReader::SplitPacket>::_List_const_iterator
              (&local_88,&local_18);
    current = std::__cxx11::
              list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
              ::erase(&this->receivedPackets,local_88);
  }
  std::__cxx11::
  list<UDPSplitPacketReader::SplitPacket,std::allocator<UDPSplitPacketReader::SplitPacket>>::
  emplace_front<int&>((list<UDPSplitPacketReader::SplitPacket,std::allocator<UDPSplitPacketReader::SplitPacket>>
                       *)&this->receivedPackets,&this->mtu);
  std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_98);
  local_98._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>::
       begin(&this->receivedPackets);
  do {
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pbVar1 = (pSVar7->super_BufferReader).super_Buffer.buf_start;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pbVar2 = (pSVar7->super_BufferReader).super_Buffer.buf_end;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    __n = (pSVar7->super_BufferReader).super_Buffer.buf_start;
    sVar8 = recv(this,(int)pbVar1,(void *)(ulong)(uint)((int)pbVar2 - (int)__n),(size_t)__n,in_R8D);
    copy._M_node._4_4_ = (int)sVar8;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pbVar1 = (pSVar7->super_BufferReader).super_Buffer.buf_start;
    lVar11 = (long)copy._M_node._4_4_;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    (pSVar7->super_BufferReader).read_end = pbVar1 + lVar11;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    (pSVar7->super_BufferReader).super_Buffer.buf_current =
         (pSVar7->super_BufferReader).super_Buffer.buf_current + 4;
    std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_b0);
    local_b8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
         ::begin(&this->receivedPackets);
    p_Var9 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator++(&local_b8);
    local_b0._M_node = p_Var9->_M_node;
    while( true ) {
      local_c0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           ::end(&this->receivedPackets);
      bVar3 = std::operator!=(&local_b0,&local_c0);
      if (!bVar3) break;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      iVar4 = SplitPacket::getID(pSVar7);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
      iVar5 = SplitPacket::getID(pSVar7);
      if (iVar4 == iVar5) {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
        iVar4 = SplitPacket::getCount(pSVar7);
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
        iVar5 = SplitPacket::getCount(pSVar7);
        if (iVar4 == iVar5) break;
      }
      local_c8 = (_List_node_base *)
                 std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator++(&local_b0,0);
    }
    local_d0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
         ::end(&this->receivedPackets);
    bVar3 = std::operator!=(&local_b0,&local_d0);
    if (!bVar3) break;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
    if ((pSVar7->hasNext & 1U) != 0) {
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7->hasNext = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
      pSVar10 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      *(undefined8 *)&(pSVar10->super_BufferReader).field_0x28 =
           *(undefined8 *)&(pSVar7->super_BufferReader).field_0x28;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->
                         ((_List_iterator<UDPSplitPacketReader::SplitPacket> *)
                          &(pSVar7->super_BufferReader).field_0x28);
      (pSVar7->previous)._M_node = local_98._M_node;
    }
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
    if ((pSVar7->hasPrevious & 1U) != 0) {
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7->hasPrevious = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
      pSVar10 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      (pSVar10->previous)._M_node = (pSVar7->previous)._M_node;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&pSVar7->previous)
      ;
      *(_List_node_base **)&(pSVar7->super_BufferReader).field_0x28 = local_98._M_node;
    }
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
    bVar3 = pSVar7->hasStart;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pSVar7->hasStart = (bool)(bVar3 & 1);
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
    pSVar10 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    (pSVar10->start)._M_node = (pSVar7->start)._M_node;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_b0);
    bVar3 = pSVar7->hasEnd;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pSVar7->hasEnd = (bool)(bVar3 & 1);
    std::_List_const_iterator<UDPSplitPacketReader::SplitPacket>::_List_const_iterator
              (&local_d8,&local_b0);
    next = std::__cxx11::
           list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           ::erase(&this->receivedPackets,local_d8);
  } while( true );
  pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
  bVar3 = SplitPacket::isFull(pSVar7);
  if (bVar3) {
    (this->currentPacket)._M_node = local_98._M_node;
    this->receivedPacket = true;
    return;
  }
  pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
  bVar3 = SplitPacket::isEnd(pSVar7);
  if (bVar3) {
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pSVar7->hasEnd = true;
  }
  else {
    std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_e8);
    local_f0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
         ::begin(&this->receivedPackets);
    p_Var9 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator++(&local_f0);
    local_e8._M_node = p_Var9->_M_node;
    while( true ) {
      local_f8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           ::end(&this->receivedPackets);
      bVar3 = std::operator!=(&local_e8,&local_f8);
      if (!bVar3) break;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      iVar4 = SplitPacket::getID(pSVar7);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_e8);
      iVar5 = SplitPacket::getID(pSVar7);
      if (iVar4 == iVar5) {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
        iVar4 = SplitPacket::getNextCount(pSVar7);
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_e8);
        iVar5 = SplitPacket::getCount(pSVar7);
        if (iVar4 == iVar5) break;
      }
      std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator++(&local_e8,0);
    }
    previous = std::__cxx11::
               list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
               ::end(&this->receivedPackets);
    bVar3 = std::operator!=(&local_e8,&previous);
    if (bVar3) {
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_e8);
      pSVar7->hasPrevious = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_e8);
      (pSVar7->previous)._M_node = local_98._M_node;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7->hasNext = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      *(_List_node_base **)&(pSVar7->super_BufferReader).field_0x28 = local_e8._M_node;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_e8);
      bVar3 = pSVar7->hasEnd;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7->hasEnd = (bool)(bVar3 & 1);
    }
  }
  pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
  bVar3 = SplitPacket::isStart(pSVar7);
  if (bVar3) {
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    (pSVar7->start)._M_node = local_98._M_node;
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    pSVar7->hasStart = true;
  }
  else {
    std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_110);
    local_118._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
         ::begin(&this->receivedPackets);
    p_Var9 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator++(&local_118);
    local_110._M_node = p_Var9->_M_node;
    while( true ) {
      local_120._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           ::end(&this->receivedPackets);
      bVar3 = std::operator!=(&local_110,&local_120);
      if (!bVar3) break;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      iVar4 = SplitPacket::getID(pSVar7);
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
      iVar5 = SplitPacket::getID(pSVar7);
      if (iVar4 == iVar5) {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
        iVar4 = SplitPacket::getPreviousCount(pSVar7);
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
        iVar5 = SplitPacket::getCount(pSVar7);
        if (iVar4 == iVar5) break;
      }
      std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator++(&local_110,0);
    }
    it_2 = std::__cxx11::
           list<UDPSplitPacketReader::SplitPacket,_std::allocator<UDPSplitPacketReader::SplitPacket>_>
           ::end(&this->receivedPackets);
    bVar3 = std::operator!=(&local_110,&it_2);
    if (bVar3) {
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
      pSVar7->hasNext = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
      *(_List_node_base **)&(pSVar7->super_BufferReader).field_0x28 = local_98._M_node;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar7->hasPrevious = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      (pSVar7->previous)._M_node = local_110._M_node;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
      if ((pSVar7->hasStart & 1U) == 0) {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
        bVar3 = SplitPacket::isStart(pSVar7);
        if (bVar3) {
          pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
          pSVar7->hasStart = true;
          pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
          (pSVar7->start)._M_node = local_110._M_node;
        }
      }
      else {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
        pSVar7->hasStart = true;
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_110);
        pSVar10 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
        (pSVar10->start)._M_node = (pSVar7->start)._M_node;
      }
    }
  }
  pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
  if (((pSVar7->hasStart & 1U) != 0) &&
     (pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98),
     (pSVar7->hasEnd & 1U) != 0)) {
    pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
    (this->currentPacket)._M_node = (pSVar7->start)._M_node;
    this->receivedPacket = true;
    return;
  }
  pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
  if ((pSVar7->hasStart & 1U) != 0) {
    std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&it_3);
    it_3._M_node = local_98._M_node;
    while (pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&it_3),
          (pSVar7->hasNext & 1U) != 0) {
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&it_3);
      it_3._M_node = *(_List_node_base **)&(pSVar7->super_BufferReader).field_0x28;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&it_3);
      if ((pSVar7->hasEnd & 1U) != 0) {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
        (this->currentPacket)._M_node = (pSVar7->start)._M_node;
        this->receivedPacket = true;
        return;
      }
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&it_3);
      pSVar7->hasStart = true;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
      pSVar10 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&it_3);
      (pSVar10->start)._M_node = (pSVar7->start)._M_node;
    }
  }
  pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_98);
  if ((pSVar7->hasEnd & 1U) != 0) {
    std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&local_140);
    local_140._M_node = local_98._M_node;
    while (pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_140),
          (pSVar7->hasPrevious & 1U) != 0) {
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_140);
      local_140._M_node = (pSVar7->previous)._M_node;
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_140);
      if ((pSVar7->hasStart & 1U) != 0) {
        pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_140);
        (this->currentPacket)._M_node = (pSVar7->start)._M_node;
        this->receivedPacket = true;
        return;
      }
      pSVar7 = std::_List_iterator<UDPSplitPacketReader::SplitPacket>::operator->(&local_140);
      pSVar7->hasEnd = true;
    }
  }
  goto LAB_00125cba;
}

Assistant:

void UDPSplitPacketReader::read_packet() {
  while(1) {
    // erase old packets
    if (receivedPackets.size() >= max || receivedPacket) {
      list<SplitPacket>::iterator current;
      if(receivedPacket) {
        current = currentPacket;
        receivedPacket = false;
      } else {
        current = --receivedPackets.end();
      }
      if (current->hasNext) {
        list<SplitPacket>::iterator it;
        it = current->next;
        while (it->hasNext) {
          list<SplitPacket>::iterator temp;
          temp = it->next;
          receivedPackets.erase(it);
          it = temp;
        }
        receivedPackets.erase(it);
      }
      if (current->hasPrevious) {
        list<SplitPacket>::iterator it;
        it = current->previous;
        while (it->hasPrevious) {
          list<SplitPacket>::iterator temp;
          temp = it->previous;
          receivedPackets.erase(it);
          it = temp;
        }
        receivedPackets.erase(it);
      }
      receivedPackets.erase(current);
    }

    // create packet
    receivedPackets.emplace_front(mtu);
    list<SplitPacket>::iterator current;
    current = receivedPackets.begin();

    // read until copy not read;
    while (1) {
      // read packet
      int length = recv(current->buf_start, current->buf_end - current->buf_start);
      current->read_end = current->buf_start + length;
      current->buf_current += 4;

      //cout << current->getCount() << endl;
      //cout << *((uint32_t *)current->buf_start) << endl;

      // find copies
      list<SplitPacket>::iterator copy;
      for (copy = ++receivedPackets.begin(); copy != receivedPackets.end(); copy++) {
        if ((current->getID() == copy->getID()) && (current->getCount() == copy->getCount())) {
          break;
        }
      }
      // if copy found
      if (copy != receivedPackets.end()) {
        // replace old with new;
        if (copy->hasNext) {
          current->hasNext = true;
          current->next = copy->next;
          current->next->previous = current;
        }
        if (copy->hasPrevious) {
          current->hasPrevious = true;
          current->previous = copy->previous;
          current->previous->next = current;
        }
        current->hasStart = copy->hasStart;
        current->start = copy->start;
        current->hasEnd = copy->hasEnd;
        receivedPackets.erase(copy);
      } else {
        break;
      }
    }

    // if full packet
    if (current->isFull()) {
      currentPacket = current;
      receivedPacket = true;
      return;
    }

    // setup next and previous links
    // for start and middle packets
    if (!current->isEnd()) {
      // find the next one.
      list<SplitPacket>::iterator next;
      // findNext
      for (next = ++receivedPackets.begin(); next != receivedPackets.end(); next++) {
        if ((current->getID() == next->getID()) && (current->getNextCount() == next->getCount())) {
          break;
        }
      }
      // next found
      if (next != receivedPackets.end()) {
        next->hasPrevious = true;
        next->previous = current;
        current->hasNext = true;
        current->next = next;
        current->hasEnd = next->hasEnd;
      }
    // for end packets
    } else {
      current->hasEnd = true;
    }
    // for middle and end packets
    if (!current->isStart()) {
      list<SplitPacket>::iterator previous;
      // findPrevious
      // previous = findPrevious(current);
      for (previous = ++receivedPackets.begin(); previous != receivedPackets.end(); previous++) {
        if ((current->getID() == previous->getID()) && (current->getPreviousCount() == previous->getCount())) {
          break;
        }
      }
      // if previous found
      if (previous != receivedPackets.end()) {
        previous->hasNext = true;
        previous->next = current;
        current->hasPrevious = true;
        current->previous = previous;
        if(previous->hasStart) {
          current->hasStart = true;
          current->start = previous->start;
        } else if (previous->isStart()) {
          current->hasStart = true;
          current->start = previous;
        }
      }
    // for start packets
    } else {
      current->start = current;
      current->hasStart = true;
    }

    // shortcut
    if(current->hasStart && current->hasEnd) {
      currentPacket = current->start;
      receivedPacket = true;
      return;
    }

    // test if all packet available and propogate values of hasEnd and hasStart
    // if connected to or is a start packet
    if (current->hasStart) {
      list<SplitPacket>::iterator it;
      it = current;
      // Indicate to following packet that there is a start
      // or return if found an end
      while(it->hasNext) {
        it = it->next;
        if (it->hasEnd) {
          currentPacket = current->start;
          receivedPacket = true;
          return;
        }
        it->hasStart = true;
        it->start = current->start;
      }
    }
    // if connected to end packet
    if (current->hasEnd) {
      list<SplitPacket>::iterator it;
      it = current;
      while(it->hasPrevious) {
        it = it->previous;
        if (it->hasStart) {
          currentPacket = it->start;
          receivedPacket = true;
          return;
        }
        it->hasEnd = true;
      }
    }

  }
}